

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *
adios2::utils::get_local_array_signature<float>
          (pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Engine *fp,IO *io,Variable<float> *variable)

{
  long lVar1;
  _Base_ptr p_Var2;
  size_t j;
  undefined8 uVar3;
  long lVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  unsigned_long uVar10;
  long *plVar11;
  long lVar12;
  size_t k;
  size_type sVar13;
  size_t k_4;
  bool bVar14;
  size_type __n;
  ulong uVar15;
  allocator_type local_89;
  Dims dims;
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  blocks;
  _Rb_tree_node_base *local_48;
  
  __n = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
  blocks.
  super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&dims,__n,(value_type_conflict1 *)&blocks,&local_89);
  if (timestep == '\x01') {
    uVar3 = (**(code **)(*(long *)fp + 0x20))(fp);
    lVar4 = (**(code **)(*(long *)fp + 0x58))(fp,variable,uVar3);
    if (lVar4 == 0) {
      (**(code **)(*(long *)fp + 0x20))(fp);
      adios2::core::Engine::BlocksInfo<float>((Variable *)&blocks,(ulong)fp);
      if (blocks.
          super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          blocks.
          super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar5 = 0;
      }
      else {
        uVar5 = ((long)blocks.
                       super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)blocks.
                      super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x198;
        bVar8 = true;
        for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
          for (sVar13 = 0; __n != sVar13; sVar13 = sVar13 + 1) {
            if (bVar8) {
              dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar13] =
                   blocks.
                   super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].Count.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar13];
            }
            else if (dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar13] !=
                     blocks.
                     super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].Count.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar13]) {
              dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar13] = 0;
            }
          }
          bVar8 = false;
        }
      }
      std::
      vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
      ::~vector(&blocks);
    }
    else {
      lVar7 = *(long *)(lVar4 + 0x20);
      uVar5 = (*(long *)(lVar4 + 0x28) - lVar7) / 0x50;
      bVar8 = true;
      for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        plVar11 = (long *)(uVar6 * 0x50 + lVar7 + 0x18);
        for (sVar13 = 0; __n != sVar13; sVar13 = sVar13 + 1) {
          if (bVar8) {
            dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[sVar13] = *(unsigned_long *)(*plVar11 + sVar13 * 8);
          }
          else if (dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar13] !=
                   *(unsigned_long *)(*plVar11 + sVar13 * 8)) {
            dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[sVar13] = 0;
          }
        }
        bVar8 = false;
      }
    }
  }
  else {
    lVar4 = (**(code **)(*(long *)fp + 0x58))(fp,variable,0);
    if (lVar4 == 0) {
      adios2::core::Engine::AllStepsBlocksInfo<float>((Variable *)&blocks);
      bVar8 = true;
      uVar5 = 0;
      bVar14 = true;
      while (local_48 !=
             (_Rb_tree_node_base *)
             &blocks.
              super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var2 = local_48[1]._M_parent;
        uVar6 = ((long)local_48[1]._M_left - (long)p_Var2) / 0x198;
        if (uVar5 != uVar6) {
          uVar5 = 0;
        }
        for (uVar10 = 0; uVar10 != uVar6; uVar10 = uVar10 + 1) {
          plVar11 = (long *)((long)p_Var2 + uVar10 * 0x198 + 0x60);
          for (sVar13 = 0; __n != sVar13; sVar13 = sVar13 + 1) {
            if (bVar14) {
              dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar13] = *(unsigned_long *)(*plVar11 + sVar13 * 8);
            }
            else if (dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar13] !=
                     *(unsigned_long *)(*plVar11 + sVar13 * 8)) {
              dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar13] = 0;
            }
          }
          bVar14 = false;
        }
        if (bVar8) {
          uVar5 = uVar6;
        }
        local_48 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_48);
        bVar8 = false;
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>_>_>_>
                   *)&blocks);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&dims,(long)*(int *)(lVar4 + 0xc));
      bVar14 = true;
      uVar5 = 0;
      bVar8 = true;
      for (uVar15 = 0; uVar15 < *(ulong *)(variable + 0xf8); uVar15 = uVar15 + 1) {
        if (uVar15 != 0) {
          lVar4 = (**(code **)(*(long *)fp + 0x58))(fp,variable,uVar15);
        }
        lVar7 = *(long *)(lVar4 + 0x20);
        lVar1 = *(long *)(lVar4 + 0x28);
        uVar6 = (lVar1 - lVar7) / 0x50;
        if (uVar5 != uVar6) {
          uVar5 = 0;
        }
        if (bVar14) {
          uVar5 = uVar6;
        }
        lVar9 = (long)dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                      .super__Vector_impl_data._M_start >> 3;
        for (; lVar7 != lVar1; lVar7 = lVar7 + 0x50) {
          lVar12 = 0;
          if (bVar8) {
            for (; lVar9 != lVar12; lVar12 = lVar12 + 1) {
              dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12] =
                   *(unsigned_long *)(*(long *)(lVar7 + 0x18) + lVar12 * 8);
            }
          }
          else {
            for (; lVar9 != lVar12; lVar12 = lVar12 + 1) {
              if (dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12] !=
                  *(unsigned_long *)(*(long *)(lVar7 + 0x18) + lVar12 * 8)) {
                dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12] = 0;
              }
            }
          }
          bVar8 = false;
        }
        bVar14 = false;
      }
    }
  }
  __return_storage_ptr__->first = uVar5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->second,&dims);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

std::pair<size_t, Dims> get_local_array_signature(core::Engine *fp, core::IO *io,
                                                  core::Variable<T> *variable)
{
    const size_t ndim = variable->m_Count.size();
    size_t nblocks = 0;
    Dims dims(ndim, 0);

    if (timestep)
    {
        const auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

        if (minBlocks)
        {
            bool firstBlock = true;
            nblocks = minBlocks->BlocksInfo.size();
            for (size_t j = 0; j < nblocks; j++)
            {
                for (size_t k = 0; k < ndim; k++)
                {
                    if (firstBlock)
                    {
                        dims[k] = minBlocks->BlocksInfo[j].Count[k];
                    }
                    else if (dims[k] != minBlocks->BlocksInfo[j].Count[k])
                    {
                        dims[k] = 0;
                    }
                }
                firstBlock = false;
            }
        }
        else
        {
            std::vector<typename core::Variable<T>::BPInfo> blocks =
                fp->BlocksInfo(*variable, fp->CurrentStep());
            if (!blocks.empty())
            {
                nblocks = blocks.size();
                bool firstBlock = true;
                for (size_t j = 0; j < nblocks; j++)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstBlock)
                        {
                            dims[k] = blocks[j].Count[k];
                        }
                        else if (dims[k] != blocks[j].Count[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstBlock = false;
                }
            }
        }
    }
    else
    {
        bool firstStep = true;
        bool firstBlock = true;

        MinVarInfo *minBlocksInfo = nullptr;
        minBlocksInfo = fp->MinBlocksInfo(*variable, 0 /* relative step 0 */);

        // first step
        if (minBlocksInfo)
        {
            dims.resize(minBlocksInfo->Dims);
            size_t RelStep = 0;
            for (RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                if (RelStep > 0)
                {
                    minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                }

                auto &coreBlocksInfo = minBlocksInfo->BlocksInfo;
                if (firstStep)
                {
                    nblocks = coreBlocksInfo.size();
                }
                else if (nblocks != coreBlocksInfo.size())
                {
                    nblocks = 0;
                }
                for (auto &coreBlockInfo : coreBlocksInfo)
                {
                    if (firstBlock)
                    {
                        for (size_t k = 0; k < dims.size(); k++)
                        {
                            dims[k] = coreBlockInfo.Count[k];
                        }
                    }
                    else
                    {
                        for (size_t k = 0; k < dims.size(); k++)
                        {
                            if (dims[k] != coreBlockInfo.Count[k])
                            {
                                dims[k] = 0;
                            }
                        }
                    }
                    firstBlock = false;
                }
                firstStep = false;
            }
        }
        else
        {
            std::map<size_t, std::vector<typename core::Variable<T>::BPInfo>> allblocks =
                fp->AllStepsBlocksInfo(*variable);

            for (auto &blockpair : allblocks)
            {
                std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
                const size_t blocksSize = blocks.size();
                if (firstStep)
                {
                    nblocks = blocksSize;
                }
                else if (nblocks != blocksSize)
                {
                    nblocks = 0;
                }

                for (size_t j = 0; j < blocksSize; j++)
                {
                    for (size_t k = 0; k < ndim; k++)
                    {
                        if (firstBlock)
                        {
                            dims[k] = blocks[j].Count[k];
                        }
                        else if (dims[k] != blocks[j].Count[k])
                        {
                            dims[k] = 0;
                        }
                    }
                    firstBlock = false;
                }
                firstStep = false;
            }
        }
    }
    return std::make_pair(nblocks, dims);
}